

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  cmd_ln_t *pcVar2;
  char *outmeanfn_00;
  char *inmeanfn_00;
  char *outgaufn_00;
  char *ingaufn_00;
  char *mllrmatfn_00;
  char *cb2mllrfn_00;
  char *moddeffn_00;
  long lVar3;
  long lVar4;
  uint32 inverse;
  uint32 cdonly;
  char *moddeffn;
  char *cb2mllrfn;
  char *mllrmatfn;
  char *ingaufn;
  char *outgaufn;
  char *inmeanfn;
  char *outmeanfn;
  char **argv_local;
  int argc_local;
  
  printf("----- Compiled on %s, %s\n\n","Apr 25 2025","21:28:38");
  iVar1 = initialize(argc,argv);
  if (iVar1 == 0) {
    pcVar2 = cmd_ln_get();
    outmeanfn_00 = cmd_ln_str_r(pcVar2,"-outmeanfn");
    pcVar2 = cmd_ln_get();
    inmeanfn_00 = cmd_ln_str_r(pcVar2,"-inmeanfn");
    pcVar2 = cmd_ln_get();
    outgaufn_00 = cmd_ln_str_r(pcVar2,"-outgaucntfn");
    pcVar2 = cmd_ln_get();
    ingaufn_00 = cmd_ln_str_r(pcVar2,"-ingaucntfn");
    pcVar2 = cmd_ln_get();
    mllrmatfn_00 = cmd_ln_str_r(pcVar2,"-mllrmat");
    pcVar2 = cmd_ln_get();
    cb2mllrfn_00 = cmd_ln_str_r(pcVar2,"-cb2mllrfn");
    pcVar2 = cmd_ln_get();
    moddeffn_00 = cmd_ln_str_r(pcVar2,"-moddeffn");
    pcVar2 = cmd_ln_get();
    lVar3 = cmd_ln_int_r(pcVar2,"-cdonly");
    pcVar2 = cmd_ln_get();
    lVar4 = cmd_ln_int_r(pcVar2,"-inverse");
    if ((mllrmatfn_00 == (char *)0x0) || (cb2mllrfn_00 == (char *)0x0)) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
              ,0x160,"You must specify all mllr files\n");
      exit(1);
    }
    if (outmeanfn_00 == (char *)0x0) {
      if (outgaufn_00 == (char *)0x0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                ,0x183,"No -outmeanfn or -outgaucntfn given, nothing done.\n");
        exit(1);
      }
      iVar1 = mllr_adapt_gaucnt(outgaufn_00,ingaufn_00,mllrmatfn_00,cb2mllrfn_00,moddeffn_00,
                                (uint32)lVar3,(uint32)lVar4);
      if (iVar1 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                ,0x17e,"Error in mllr_adapt_mean().\n");
        exit(1);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
              ,0x17a,"mllr_adapt finished successfully.\n");
    }
    else {
      iVar1 = mllr_adapt_mean(outmeanfn_00,inmeanfn_00,mllrmatfn_00,cb2mllrfn_00,moddeffn_00,
                              (uint32)lVar3,(uint32)lVar4);
      if (iVar1 != 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
                ,0x16e,"Error in mllr_adapt_mean().\n");
        exit(1);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
              ,0x16a,"mllr_adapt finished successfully.\n");
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mllr_transform/main.c"
            ,0x151,"Errors initializing.\n");
  }
  return 0;
}

Assistant:

int
main(int argc, char *argv[])
{
    const char 	*outmeanfn, *inmeanfn;
    const char 	*outgaufn, *ingaufn;
    const char 	*mllrmatfn, *cb2mllrfn, *moddeffn;
    uint32     	cdonly, inverse;

    printf("----- Compiled on %s, %s\n\n",__DATE__,__TIME__);

    if (initialize(argc, argv) != S3_SUCCESS) {
	E_ERROR("Errors initializing.\n");
	return 0;
    }

    outmeanfn = cmd_ln_str("-outmeanfn");
    inmeanfn  = cmd_ln_str("-inmeanfn");
    outgaufn  = cmd_ln_str("-outgaucntfn");
    ingaufn   = cmd_ln_str("-ingaucntfn");
    mllrmatfn = cmd_ln_str("-mllrmat");
    cb2mllrfn = cmd_ln_str("-cb2mllrfn");
    moddeffn  = cmd_ln_str("-moddeffn");
    cdonly    = cmd_ln_int32("-cdonly");
    inverse   = cmd_ln_int32("-inverse");

    if (! (mllrmatfn && cb2mllrfn)) {
	E_FATAL("You must specify all mllr files\n");
    }
    if (outmeanfn) {
	if (mllr_adapt_mean(outmeanfn,
			    inmeanfn,
			    mllrmatfn,
			    cb2mllrfn,
			    moddeffn,
			    cdonly,
			    inverse) == S3_SUCCESS) {
	    E_INFO("mllr_adapt finished successfully.\n");
	    return(0);
	}
	else {
	    E_FATAL("Error in mllr_adapt_mean().\n");
	    return (1);
	}
    }
    else if (outgaufn) {
	if (mllr_adapt_gaucnt(outgaufn,
			      ingaufn,
			      mllrmatfn,
			      cb2mllrfn,
			      moddeffn,
			      cdonly,
			      inverse) == S3_SUCCESS) {
	    E_INFO("mllr_adapt finished successfully.\n");
	    return(0);
	}
	else {
	    E_FATAL("Error in mllr_adapt_mean().\n");
	    return (1);
	}
    }
    else {
	E_FATAL("No -outmeanfn or -outgaucntfn given, nothing done.\n");
    }
    return 0 ;
}